

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void slang::ast::VariableSymbol::fromSyntax
               (Compilation *compilation,DataDeclarationSyntax *syntax,Scope *scope,
               bool isCheckerFreeVar,SmallVectorBase<slang::ast::VariableSymbol_*> *results)

{
  Token *this;
  undefined1 *puVar1;
  Token *pTVar2;
  size_t sVar3;
  pointer pTVar4;
  char *pcVar5;
  DeclaratorSyntax *decl;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined2 uVar6;
  DataDeclarationSyntax *pDVar7;
  bool bVar8;
  Symbol *sym;
  Symbol *pSVar9;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  VariableSymbol *this_00;
  SymbolKind SVar11;
  undefined7 in_register_00000009;
  uint uVar12;
  undefined8 uVar13;
  undefined8 extraout_RDX;
  bool bVar14;
  long lVar15;
  ulong uVar16;
  SourceRange SVar17;
  optional<slang::ast::VariableLifetime> lifetime;
  Token mod;
  ulong local_80;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  Token local_68;
  DataDeclarationSyntax *local_58;
  uint local_4c;
  Compilation *local_48;
  SmallVectorBase<slang::ast::VariableSymbol_*> *local_40;
  SourceLocation local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,isCheckerFreeVar);
  local_48 = compilation;
  local_40 = results;
  bVar8 = Scope::isProceduralContext(scope);
  local_80._0_5_ = (uint5)(VariableLifetime)local_80;
  sVar3 = (syntax->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  uVar13 = 0;
  local_58 = syntax;
  if (sVar3 == 0) {
    local_4c = 0;
  }
  else {
    pTVar4 = (syntax->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
    lVar15 = 0;
    bVar14 = false;
    local_4c = 0;
    do {
      pTVar2 = (Token *)((long)&pTVar4->kind + lVar15);
      uVar6 = pTVar2->kind;
      local_68 = *pTVar2;
      if ((ushort)uVar6 < StaticKeyword) {
        if (uVar6 == AutomaticKeyword) {
          local_80 = 0x100000000;
          bVar14 = true;
          if (!bVar8) {
            SVar17 = parsing::Token::range(&local_68);
            Scope::addDiag(scope,(DiagCode)0x50006,SVar17);
            bVar14 = true;
            local_80 = 0x100000001;
            uVar13 = extraout_RDX;
          }
        }
        else {
          local_4c = 1;
        }
      }
      else if (uVar6 == StaticKeyword) {
        local_80 = 0x100000001;
        bVar14 = true;
      }
      lVar15 = lVar15 + 0x10;
    } while (sVar3 << 4 != lVar15);
    if (bVar14) {
      pSVar9 = scope->thisSym;
      SVar11 = pSVar9->kind;
      local_70 = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),1);
      goto LAB_00313e50;
    }
  }
  uVar12 = 0;
  pSVar9 = scope->thisSym;
  SVar11 = pSVar9->kind;
  if (SVar11 != MethodPrototype) {
    if (SVar11 == Subroutine) {
      uVar12 = *(uint *)&pSVar9[2].originatingSyntax;
    }
    else if (SVar11 == StatementBlock) {
      uVar12 = *(uint *)((long)&pSVar9[1].originatingSyntax + 4);
    }
    else {
      uVar12 = 1;
    }
  }
  local_80 = (ulong)uVar12 | 0x100000000;
  local_70 = 0;
LAB_00313e50:
  pDVar7 = local_58;
  if (SVar11 == InstanceBody) {
    pcVar5 = pSVar9[2].name._M_str;
    local_74 = (undefined4)CONCAT71((int7)((ulong)pcVar5 >> 8),*(int *)(pcVar5 + 0x48) == 1);
  }
  else {
    local_74 = 0;
  }
  uVar16 = (local_58->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar16) {
    uVar16 = uVar16 >> 1;
    lVar15 = 0;
    do {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((pDVar7->declarators).elements._M_ptr)->
                                    super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar15));
      decl = (DeclaratorSyntax *)*ppSVar10;
      this = &decl->name;
      local_68 = (Token)parsing::Token::valueText(this);
      local_38 = parsing::Token::location(this);
      this_00 = BumpAllocator::
                emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&>
                          (&local_48->super_BumpAllocator,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_68,&local_38,
                           (VariableLifetime *)&local_80);
      local_68._0_8_ = this_00;
      (this_00->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pDVar7->type).ptr;
      puVar1 = &(this_00->super_ValueSymbol).declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      ValueSymbol::setFromDeclarator(&this_00->super_ValueSymbol,decl);
      syntax_00._M_ptr =
           (pDVar7->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (pDVar7->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)local_68._0_8_,scope,syntax_00);
      SmallVectorBase<slang::ast::VariableSymbol*>::emplace_back<slang::ast::VariableSymbol*const&>
                ((SmallVectorBase<slang::ast::VariableSymbol*> *)local_40,
                 (VariableSymbol **)&local_68);
      uVar12 = local_4c;
      if ((local_4c & 1) != 0) {
        *(ushort *)(local_68._0_8_ + 0x154) = *(ushort *)(local_68._0_8_ + 0x154) | 1;
      }
      if ((char)local_6c != '\0') {
        *(ushort *)(local_68._0_8_ + 0x154) = *(ushort *)(local_68._0_8_ + 0x154) | 0x10;
      }
      if ((char)local_74 != '\0') {
        *(uint *)(local_68._0_8_ + 0x78) = *(uint *)(local_68._0_8_ + 0x78) | 0x10000;
      }
      if ((((VariableLifetime)local_80 == Static && (char)local_70 == '\0') &&
          (decl->initializer != (EqualsValueClauseSyntax *)0x0)) &&
         (bVar8 = Scope::isProceduralContext(scope), bVar8)) {
        SVar17 = parsing::Token::range(this);
        Scope::addDiag(scope,(DiagCode)0xf90006,SVar17);
      }
      if (((uVar12 & 1) != 0) &&
         (decl->initializer == (EqualsValueClauseSyntax *)0x0 && (char)local_6c == '\0')) {
        SVar17 = parsing::Token::range(this);
        Scope::addDiag(scope,(DiagCode)0x1f0006,SVar17);
      }
      lVar15 = lVar15 + 0x30;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  return;
}

Assistant:

void VariableSymbol::fromSyntax(Compilation& compilation, const DataDeclarationSyntax& syntax,
                                const Scope& scope, bool isCheckerFreeVar,
                                SmallVectorBase<VariableSymbol*>& results) {
    bool isConst = false;
    bool inProceduralContext = scope.isProceduralContext();
    std::optional<VariableLifetime> lifetime;
    for (Token mod : syntax.modifiers) {
        switch (mod.kind) {
            case TokenKind::VarKeyword:
                break;
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                // Static lifetimes are allowed in all contexts.
                lifetime = VariableLifetime::Static;
                break;
            case TokenKind::AutomaticKeyword:
                // Automatic lifetimes are only allowed in procedural contexts.
                lifetime = VariableLifetime::Automatic;
                if (!inProceduralContext) {
                    scope.addDiag(diag::AutomaticNotAllowed, mod.range());
                    lifetime = VariableLifetime::Static;
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    // If no explicit lifetime is provided, find the default one for this scope.
    bool hasExplicitLifetime = lifetime.has_value();
    if (!hasExplicitLifetime)
        lifetime = getDefaultLifetime(scope);

    const bool isInIface =
        scope.asSymbol().kind == SymbolKind::InstanceBody &&
        scope.asSymbol().as<InstanceBodySymbol>().getDefinition().definitionKind ==
            DefinitionKind::Interface;

    for (auto declarator : syntax.declarators) {
        auto variable = compilation.emplace<VariableSymbol>(declarator->name.valueText(),
                                                            declarator->name.location(), *lifetime);
        variable->setDeclaredType(*syntax.type);
        variable->setFromDeclarator(*declarator);
        variable->setAttributes(scope, syntax.attributes);
        results.push_back(variable);

        if (isConst)
            variable->flags |= VariableFlags::Const;

        if (isCheckerFreeVar)
            variable->flags |= VariableFlags::CheckerFreeVariable;

        if (isInIface)
            variable->getDeclaredType()->addFlags(DeclaredTypeFlags::InterfaceVariable);

        // If this is a static variable in a procedural context and it has an initializer,
        // the spec requires that the static keyword must be explicitly provided.
        if (*lifetime == VariableLifetime::Static && !hasExplicitLifetime &&
            declarator->initializer && scope.isProceduralContext()) {
            scope.addDiag(diag::StaticInitializerMustBeExplicit, declarator->name.range());
        }

        // Constants require an initializer.
        if (isConst && !declarator->initializer && !isCheckerFreeVar)
            scope.addDiag(diag::ConstVarNoInitializer, declarator->name.range());
    }
}